

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O3

ndn_pit_entry_t * ndn_pit_find_or_insert(ndn_pit_t *self,uint8_t *name,size_t length)

{
  ndn_table_id_t nVar1;
  nametree_entry_t *entry;
  ulong uVar2;
  ndn_table_id_t *pnVar3;
  
  entry = ndn_nametree_find_or_insert(self->nametree,name,length);
  if (entry != (nametree_entry_t *)0x0) {
    uVar2 = (ulong)entry->pit_id;
    if (entry->pit_id != 0xffff) {
LAB_00114266:
      return (ndn_pit_entry_t *)((long)&self[1].nametree + (ulong)(((uint)uVar2 & 0xffff) * 0x50));
    }
    nVar1 = ndn_nametree_getid(self->nametree,entry);
    if ((ulong)self->capacity != 0) {
      pnVar3 = &self[5].capacity;
      uVar2 = 0;
      do {
        if (*pnVar3 == 0xffff) {
          pnVar3[-0xc] = 0;
          pnVar3[-0xb] = 0;
          pnVar3[-10] = 0;
          pnVar3[-9] = 0;
          pnVar3[-8] = 0;
          pnVar3[-7] = 0;
          pnVar3[-6] = 0;
          pnVar3[-5] = 0;
          pnVar3[-0x14] = 0;
          pnVar3[-0x13] = 0;
          pnVar3[-0x12] = 0;
          pnVar3[-0x11] = 0;
          pnVar3[-0x10] = 0;
          pnVar3[-0xf] = 0;
          pnVar3[-0xe] = 0;
          pnVar3[-0xd] = 0;
          pnVar3[-0x1c] = 0;
          pnVar3[-0x1b] = 0;
          pnVar3[-0x1a] = 0;
          pnVar3[-0x19] = 0;
          pnVar3[-0x18] = 0;
          pnVar3[-0x17] = 0;
          pnVar3[-0x16] = 0;
          pnVar3[-0x15] = 0;
          ((ndn_pit_t *)(pnVar3 + -4))->nametree = (ndn_nametree_t *)0x0;
          *pnVar3 = nVar1;
          entry->pit_id = (ndn_table_id_t)uVar2;
          if (uVar2 == 0xffff) {
            return (ndn_pit_entry_t *)0x0;
          }
          goto LAB_00114266;
        }
        uVar2 = uVar2 + 1;
        pnVar3 = pnVar3 + 0x28;
      } while (self->capacity != uVar2);
    }
    entry->pit_id = 0xffff;
  }
  return (ndn_pit_entry_t *)0x0;
}

Assistant:

ndn_pit_entry_t*
ndn_pit_find_or_insert(ndn_pit_t* self, uint8_t* name, size_t length){
  nametree_entry_t* entry = ndn_nametree_find_or_insert(self->nametree, name, length);
  if(entry == NULL){
    return NULL;
  }
  if(entry->pit_id == NDN_INVALID_ID){
    entry->pit_id = ndn_pit_add_new_entry(self, ndn_nametree_getid(self->nametree, entry));
    NDN_LOG_DEBUG("[PIT] Add a new PIT entry\n");
    if(entry->pit_id == NDN_INVALID_ID){
      return NULL;
    }
  }
  return &self->slots[entry->pit_id];
}